

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_io_foreach_event_fn(event_base *base,int fd,evmap_io *io_info,void *arg)

{
  event *peVar1;
  int iVar2;
  
  do {
    peVar1 = (io_info->events).lh_first;
    if (peVar1 == (event *)0x0) {
      return 0;
    }
    iVar2 = (**arg)(base,peVar1,*(undefined8 *)((long)arg + 8));
    io_info = (evmap_io *)&peVar1->ev_;
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

static int
evmap_io_foreach_event_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *io_info, void *arg)
{
	struct evmap_foreach_event_helper *h = arg;
	struct event *ev;
	int r;
	LIST_FOREACH(ev, &io_info->events, ev_io_next) {
		if ((r = h->fn(base, ev, h->arg)))
			return r;
	}
	return 0;
}